

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::Parser(Parser *this,Parser *that)

{
  undefined8 uVar1;
  Location loc;
  bool bVar2;
  error_flags eVar3;
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  stack<c4::yml::Parser::State,_16UL> *in_stack_ffffffffffffff58;
  Parser *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  Location *in_stack_ffffffffffffff70;
  char (*in_stack_ffffffffffffffb0) [25];
  undefined4 *puVar4;
  undefined8 in_stack_ffffffffffffffd0;
  Parser *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  *in_RDI = *in_RSI;
  *(undefined8 *)(in_RDI + 2) = *(undefined8 *)(in_RSI + 2);
  *(undefined8 *)(in_RDI + 4) = *(undefined8 *)(in_RSI + 4);
  *(undefined8 *)(in_RDI + 6) = *(undefined8 *)(in_RSI + 6);
  *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RSI + 8);
  *(undefined8 *)(in_RDI + 10) = *(undefined8 *)(in_RSI + 10);
  *(undefined8 *)(in_RDI + 0xc) = *(undefined8 *)(in_RSI + 0xc);
  puVar4 = in_RDI;
  detail::stack<c4::yml::Parser::State,_16UL>::stack
            ((stack<c4::yml::Parser::State,_16UL> *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  if (*(long *)(in_RDI + 0x270) == 0) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                       (size_t)in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff60 = in_stack_ffffffffffffffd8;
    loc.super_LineCol.line = (size_t)puVar4;
    loc.super_LineCol.offset = (size_t)in_RSI;
    loc.super_LineCol.col = in_stack_ffffffffffffffd0;
    loc.name.str = (char *)in_stack_ffffffffffffff60;
    loc.name.len = in_stack_ffffffffffffffe0;
    error<25ul>(in_stack_ffffffffffffffb0,loc);
  }
  *(long *)(in_RDI + 0x27c) = *(long *)(in_RDI + 0x26e) + (*(long *)(in_RDI + 0x270) + -1) * 0x98;
  *(undefined8 *)(in_RDI + 0x27e) = *(undefined8 *)(in_RSI + 0x27e);
  *(undefined8 *)(in_RDI + 0x280) = *(undefined8 *)(in_RSI + 0x280);
  uVar1 = *(undefined8 *)(in_RSI + 0x284);
  *(undefined8 *)(in_RDI + 0x282) = *(undefined8 *)(in_RSI + 0x282);
  *(undefined8 *)(in_RDI + 0x284) = uVar1;
  uVar1 = *(undefined8 *)(in_RSI + 0x288);
  *(undefined8 *)(in_RDI + 0x286) = *(undefined8 *)(in_RSI + 0x286);
  *(undefined8 *)(in_RDI + 0x288) = uVar1;
  *(undefined8 *)(in_RDI + 0x28a) = *(undefined8 *)(in_RSI + 0x28a);
  uVar1 = *(undefined8 *)(in_RSI + 0x28e);
  *(undefined8 *)(in_RDI + 0x28c) = *(undefined8 *)(in_RSI + 0x28c);
  *(undefined8 *)(in_RDI + 0x28e) = uVar1;
  *(byte *)(in_RDI + 0x290) = *(byte *)(in_RSI + 0x290) & 1;
  *(undefined8 *)(in_RDI + 0x292) = *(undefined8 *)(in_RSI + 0x292);
  uVar1 = *(undefined8 *)(in_RSI + 0x296);
  *(undefined8 *)(in_RDI + 0x294) = *(undefined8 *)(in_RSI + 0x294);
  *(undefined8 *)(in_RDI + 0x296) = uVar1;
  *(undefined8 *)(in_RDI + 0x298) = *(undefined8 *)(in_RSI + 0x298);
  uVar1 = *(undefined8 *)(in_RSI + 0x29c);
  *(undefined8 *)(in_RDI + 0x29a) = *(undefined8 *)(in_RSI + 0x29a);
  *(undefined8 *)(in_RDI + 0x29c) = uVar1;
  uVar1 = *(undefined8 *)(in_RSI + 0x2a0);
  *(undefined8 *)(in_RDI + 0x29e) = *(undefined8 *)(in_RSI + 0x29e);
  *(undefined8 *)(in_RDI + 0x2a0) = uVar1;
  *(undefined8 *)(in_RDI + 0x2a2) = *(undefined8 *)(in_RSI + 0x2a2);
  *(undefined8 *)(in_RDI + 0x2a4) = *(undefined8 *)(in_RSI + 0x2a4);
  *(undefined8 *)(in_RDI + 0x2a6) = *(undefined8 *)(in_RSI + 0x2a6);
  uVar1 = *(undefined8 *)(in_RSI + 0x2aa);
  *(undefined8 *)(in_RDI + 0x2a8) = *(undefined8 *)(in_RSI + 0x2a8);
  *(undefined8 *)(in_RDI + 0x2aa) = uVar1;
  _clr(in_stack_ffffffffffffff60);
  return;
}

Assistant:

Parser::Parser(Parser &&that)
    : m_options(that.m_options)
    , m_file(that.m_file)
    , m_buf(that.m_buf)
    , m_root_id(that.m_root_id)
    , m_tree(that.m_tree)
    , m_stack(std::move(that.m_stack))
    , m_state(&m_stack.top())
    , m_key_tag_indentation(that.m_key_tag_indentation)
    , m_key_tag2_indentation(that.m_key_tag2_indentation)
    , m_key_tag(that.m_key_tag)
    , m_key_tag2(that.m_key_tag2)
    , m_val_tag_indentation(that.m_val_tag_indentation)
    , m_val_tag(that.m_val_tag)
    , m_key_anchor_was_before(that.m_key_anchor_was_before)
    , m_key_anchor_indentation(that.m_key_anchor_indentation)
    , m_key_anchor(that.m_key_anchor)
    , m_val_anchor_indentation(that.m_val_anchor_indentation)
    , m_val_anchor(that.m_val_anchor)
    , m_filter_arena(that.m_filter_arena)
    , m_newline_offsets(that.m_newline_offsets)
    , m_newline_offsets_size(that.m_newline_offsets_size)
    , m_newline_offsets_capacity(that.m_newline_offsets_capacity)
    , m_newline_offsets_buf(that.m_newline_offsets_buf)
{
    that._clr();
}